

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O1

istream * operator>>(istream *i,Scope *s)

{
  iterator __position;
  int iVar1;
  ostream *poVar2;
  long lVar3;
  char c;
  Index Index;
  char local_2b;
  char local_2a;
  char local_29;
  uint local_28;
  uint local_24;
  
  local_2b = '\0';
  std::operator>>(i,&local_2b);
  iVar1 = (int)i;
  if (local_2b != '<') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Scope extraction error: expected \'<\', but got \'",0x2f);
    local_2a = local_2b;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,&local_2a,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' !",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)i + -0x18));
  }
  lVar3 = *(long *)(*(long *)i + -0x18);
  if (*(int *)(i + lVar3 + 0x20) == 0) {
    do {
      std::istream::_M_extract<unsigned_int>((uint *)i);
      if (*(int *)(i + *(long *)(*(long *)i + -0x18) + 0x20) == 0) {
        local_24 = local_28;
        __position._M_current =
             (s->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (s->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)s,__position,&local_24);
        }
        else {
          *__position._M_current = local_28;
          (s->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      lVar3 = *(long *)(*(long *)i + -0x18);
    } while (*(int *)(i + lVar3 + 0x20) == 0);
  }
  std::ios::clear((int)lVar3 + iVar1);
  std::operator>>(i,&local_2b);
  if (local_2b != '>') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Scope extraction error: expected \'>\', but got \'",0x2f);
    local_29 = local_2b;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,&local_29,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' !",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)i + -0x18));
  }
  return i;
}

Assistant:

istream& operator>> (istream& i, Scope& s)
{
    char c = 0;
    i >> c;
    if(c != '<')
    {
        cerr << "Scope extraction error: expected '<', but got '"<<c<<"' !" << endl;
        i.setstate(ios_base::failbit);
    }
    while( i.good() )
    {
        Index Index;
        i >> Index;   
#if 0        
        cout << "parsed Index="<<Index;
        cout << ",\ti.good="<<i.good();
        cout << ",\ti.eof="<<i.eof();
        cout << ",\ti.fail="<<i.fail();
        cout << ",\ti.bad="<<i.bad()<<endl;
#endif        
        if(i.good() )
            s.Insert(Index);
    }
    //failed to parse an Index
    i.clear(); //reset status
    i >> c;
    if(c != '>')
    {
        cerr << "Scope extraction error: expected '>', but got '"<<c<<"' !" << endl;
        i.setstate(ios_base::failbit);
    }

    return i;
}